

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::DebugOutStream::DebugOutStream(DebugOutStream *this)

{
  StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this_00;
  
  (this->super_IStream)._vptr_IStream = (_func_int **)&PTR__DebugOutStream_0017fbd0;
  this_00 = (StreamBufImpl<Catch::OutputDebugWriter,_256UL> *)operator_new(0x148);
  StreamBufImpl<Catch::OutputDebugWriter,_256UL>::StreamBufImpl(this_00);
  (this->m_streamBuf)._M_ptr = (StreamBufBase *)this_00;
  std::ostream::ostream(&this->m_os,(streambuf *)this_00);
  return;
}

Assistant:

DebugOutStream::DebugOutStream()
    :   m_streamBuf( new StreamBufImpl<OutputDebugWriter>() ),
        m_os( m_streamBuf.get() )
    {}